

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O2

int Ucs1CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  uint uVar2;
  uint *data;
  bool bVar3;
  
  data = (uint *)chunks->data;
  do {
    bVar3 = length == 0;
    length = length - 1;
    if (bVar3) {
      return 0;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UTF16) {
      uVar2 = Col_Utf16Get((Col_Char2 *)data);
LAB_001096bc:
      if (uVar2 < 0x100) goto LAB_001096cb;
LAB_001096c3:
      uVar2 = *(uint *)((long)clientData + 8);
      if (uVar2 != 0xffffffff) goto LAB_001096cb;
    }
    else {
      if (CVar1 == COL_UCS2) {
        uVar2 = (uint)(ushort)*data;
        goto LAB_001096bc;
      }
      if (CVar1 == COL_UCS4) {
        uVar2 = *data;
        goto LAB_001096bc;
      }
      if (CVar1 == COL_UTF8) {
        uVar2 = Col_Utf8Get((Col_Char1 *)data);
        goto LAB_001096bc;
      }
      if (CVar1 != COL_UCS1) goto LAB_001096c3;
      uVar2 = (uint)(byte)*data;
LAB_001096cb:
      **clientData = (char)uVar2;
      *(long *)clientData = *clientData + 1;
    }
    CVar1 = chunks->format;
    if (CVar1 == COL_UCS1) {
      data = (uint *)((long)data + 1);
    }
    else if (CVar1 == COL_UCS2) {
      data = (uint *)((long)data + 2);
    }
    else if (CVar1 == COL_UCS4) {
      data = data + 1;
    }
    else if (CVar1 == COL_UTF8) {
      data = (uint *)Col_Utf8Next((Col_Char1 *)data);
    }
    else if (CVar1 == COL_UTF16) {
      data = (uint *)Col_Utf16Next((Col_Char2 *)data);
    }
    else {
      data = (uint *)0x0;
    }
  } while( true );
}

Assistant:

static int
Ucs1CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c > COL_CHAR1_MAX) {
            if (info->replace == COL_CHAR_INVALID) continue;
            c = info->replace;
        }
        *(Col_Char1 *) info->data = c;
        info->data += CHAR_WIDTH(COL_UCS1);
    }
    return 0;
}